

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessor.cpp
# Opt level: O0

bool __thiscall
solitaire::events::EventsProcessor::checkIfCollidesAndTryClickButtons
          (EventsProcessor *this,MouseLeftButtonDown *event)

{
  int iVar1;
  undefined4 extraout_var;
  ulong uVar2;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  MouseLeftButtonDown *event_local;
  EventsProcessor *this_local;
  
  iVar1 = (*this->context->_vptr_Context[0xc])();
  uVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x18))
                    ((long *)CONCAT44(extraout_var,iVar1),event);
  if ((uVar2 & 1) == 0) {
    iVar1 = (*this->context->_vptr_Context[0xe])();
    uVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x18))
                      ((long *)CONCAT44(extraout_var_01,iVar1),event);
    if ((uVar2 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      iVar1 = (*this->context->_vptr_Context[4])();
      (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar1) + 0x18))();
      this_local._7_1_ = true;
    }
  }
  else {
    iVar1 = (*this->context->_vptr_Context[4])();
    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x10))();
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool EventsProcessor::checkIfCollidesAndTryClickButtons(
    const MouseLeftButtonDown& event) const
{
    if (context.getNewGameButton().collidesWith(event.position)) {
        context.getSolitaire().startNewGame();
        return true;
    }
    if (context.getUndoButton().collidesWith(event.position)) {
        context.getSolitaire().tryUndoOperation();
        return true;
    }
    return false;
}